

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::MakeCurrent::exec(MakeCurrent *this,Thread *t)

{
  EGLDisplay pvVar1;
  EGLSurface pvVar2;
  EGLSurface pvVar3;
  _func_int **pp_Var4;
  bool bVar5;
  deUint32 dVar6;
  deBool dVar7;
  Surface *pSVar8;
  GLES2Context *pGVar9;
  MessageBuilder *pMVar10;
  MessageBuilder local_670;
  MessageBuilder local_4e0;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  MakeCurrent *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  bVar5 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_context);
  if (bVar5) {
    pSVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator->(&this->m_surface);
    local_20[1].m_messageLock.m_mutex = (deMutex)pSVar8->surface;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=
              ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&local_20[1].m_random,
               &this->m_context);
    tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<
                        (&local_1b0,(char (*) [25])"Begin -- eglMakeCurrent(");
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,&this->m_display);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x584b6d);
    pSVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator->(&this->m_surface);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,&pSVar8->surface);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x584b6d);
    pSVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator->(&this->m_surface);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,&pSVar8->surface);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x584b6d);
    pGVar9 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,&pGVar9->context);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x5b492c);
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
    do {
      pp_Var4 = local_20[1].super_Thread._vptr_Thread;
      pvVar1 = this->m_display;
      pSVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator->(&this->m_surface);
      pvVar2 = pSVar8->surface;
      pSVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator->(&this->m_surface);
      pvVar3 = pSVar8->surface;
      pGVar9 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context)
      ;
      (**(code **)(*pp_Var4 + 0x138))(pp_Var4,pvVar1,pvVar2,pvVar3,pGVar9->context);
      dVar6 = (**(code **)(*local_20[1].super_Thread._vptr_Thread + 0xf8))();
      eglu::checkError(dVar6,
                       "makeCurrent(m_display, m_surface->surface, m_surface->surface, m_context->context)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                       ,0x2c9);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<
                        (&local_350,(char (*) [24])"End -- eglMakeCurrent()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
  }
  else {
    de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=
              ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&local_20[1].m_random,
               &this->m_context);
    tcu::ThreadUtil::Thread::newMessage(&local_4e0,local_20);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<
                        (&local_4e0,(char (*) [25])"Begin -- eglMakeCurrent(");
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,&this->m_display);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,(char (*) [50])0x58074a);
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4e0);
    do {
      pp_Var4 = local_20[1].super_Thread._vptr_Thread;
      (**(code **)(*pp_Var4 + 0x138))(pp_Var4,this->m_display,0,0);
      dVar6 = (**(code **)(*local_20[1].super_Thread._vptr_Thread + 0xf8))();
      eglu::checkError(dVar6,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                       ,0x2d1);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    tcu::ThreadUtil::Thread::newMessage(&local_670,local_20);
    pMVar10 = tcu::ThreadUtil::MessageBuilder::operator<<
                        (&local_670,(char (*) [24])"End -- eglMakeCurrent()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar10,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_670);
  }
  return;
}

Assistant:

void MakeCurrent::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	if (m_context)
	{
		thread.eglSurface = m_surface->surface;
		thread.runtimeContext = m_context;

		DE_ASSERT(m_surface);
		thread.newMessage() << "Begin -- eglMakeCurrent(" << m_display << ", " << m_surface->surface << ", " << m_surface->surface << ", " << m_context->context << ")" << tcu::ThreadUtil::Message::End;
		EGLU_CHECK_CALL(thread.egl, makeCurrent(m_display, m_surface->surface, m_surface->surface, m_context->context));
		thread.newMessage() << "End -- eglMakeCurrent()" << tcu::ThreadUtil::Message::End;
	}
	else
	{
		thread.runtimeContext = m_context;

		thread.newMessage() << "Begin -- eglMakeCurrent(" << m_display << ", EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)" << tcu::ThreadUtil::Message::End;
		EGLU_CHECK_CALL(thread.egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		thread.newMessage() << "End -- eglMakeCurrent()" << tcu::ThreadUtil::Message::End;
	}
}